

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adx.c
# Opt level: O3

ErrorNumber test_func_adx(TA_History *history)

{
  TA_RetCode TVar1;
  ErrorNumber EVar2;
  ulong uVar3;
  ulong uVar4;
  TA_FuncUnstId unstId;
  uint integerTolerance;
  TA_Test_conflict2 *pTVar5;
  TA_Integer outNbElement;
  TA_Integer outBegIdx;
  TA_Test_conflict2 *local_50;
  TA_Real *local_48;
  TA_Real *pTStack_40;
  TA_Real *local_38;
  
  TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
  pTVar5 = tableTest;
  uVar3 = 0;
  do {
    if ((int)history->nbBars < pTVar5->expectedNbElement) {
      printf("%s Failed Bad Parameter for Test #%d (%d,%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_adx.c"
             ,uVar3 & 0xffffffff);
      return TA_TESTUTIL_TFRR_BAD_PARAM;
    }
    clearAllBuffers();
    setInputBuffer(0,history->high,history->nbBars);
    setInputBuffer(1,history->low,history->nbBars);
    TVar1 = TA_BAD_PARAM;
    setInputBuffer(2,history->close,history->nbBars);
    setInputBuffer(3,history->high,history->nbBars);
    switch(pTVar5->id) {
    case TEST_STOCH:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_MINUS_DM,pTVar5->unstablePeriod);
      if (TVar1 != TA_SUCCESS) {
LAB_00115724:
        uVar4 = 0x8a;
        goto LAB_00115729;
      }
      TVar1 = TA_MINUS_DM(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,
                          pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TEST_STOCHF:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_MINUS_DI,pTVar5->unstablePeriod);
      if (TVar1 != TA_SUCCESS) goto LAB_00115724;
      TVar1 = TA_MINUS_DI(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                          pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TEST_STOCHRSI:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_PLUS_DM,pTVar5->unstablePeriod);
      if (TVar1 != TA_SUCCESS) goto LAB_00115724;
      TVar1 = TA_PLUS_DM(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,
                         pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TST_PLUS_DI:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_PLUS_DI,pTVar5->unstablePeriod);
      if (TVar1 != TA_SUCCESS) goto LAB_00115724;
      TVar1 = TA_PLUS_DI(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                         pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TST_DX:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_DX,pTVar5->unstablePeriod);
      if (TVar1 != TA_SUCCESS) goto LAB_00115724;
      TVar1 = TA_DX(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                    pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TST_ADX:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_ADX,pTVar5->unstablePeriod);
      if (TVar1 != TA_SUCCESS) goto LAB_00115724;
      TVar1 = TA_ADX(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                     pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
      break;
    case TST_ADXR:
      TVar1 = TA_SetUnstablePeriod(TA_FUNC_UNST_ADX,pTVar5->unstablePeriod);
      if (TVar1 != TA_SUCCESS) goto LAB_00115724;
      TVar1 = TA_ADXR(pTVar5->startIdx,pTVar5->endIdx,gBuffer[0].in,gBuffer[1].in,gBuffer[2].in,
                      pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[0].out0);
    }
    EVar2 = checkDataSame(gBuffer[0].in,history->high,history->nbBars);
    if (((EVar2 != TA_TEST_PASS) ||
        (EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars), EVar2 != TA_TEST_PASS))
       || (EVar2 = checkDataSame(gBuffer[2].in,history->close,history->nbBars),
          EVar2 != TA_TEST_PASS)) {
LAB_001156ee:
      uVar4 = (ulong)EVar2;
      goto LAB_00115729;
    }
    EVar2 = checkExpectedValue(gBuffer[0].out0,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal0,
                               pTVar5->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) {
LAB_001156f2:
      uVar4 = (ulong)EVar2;
      printf("Fail for output id=%d\n",0);
      goto LAB_00115729;
    }
    outNbElement = 0;
    outBegIdx = 0;
    switch(pTVar5->id) {
    case TEST_STOCH:
      TVar1 = TA_MINUS_DM(pTVar5->startIdx,pTVar5->endIdx,gBuffer[3].in,gBuffer[1].in,
                          pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TEST_STOCHF:
      TVar1 = TA_MINUS_DI(pTVar5->startIdx,pTVar5->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                          pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TEST_STOCHRSI:
      TVar1 = TA_PLUS_DM(pTVar5->startIdx,pTVar5->endIdx,gBuffer[3].in,gBuffer[1].in,
                         pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TST_PLUS_DI:
      TVar1 = TA_PLUS_DI(pTVar5->startIdx,pTVar5->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                         pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TST_DX:
      TVar1 = TA_DX(pTVar5->startIdx,pTVar5->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                    pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TST_ADX:
      TVar1 = TA_ADX(pTVar5->startIdx,pTVar5->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                     pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    case TST_ADXR:
      TVar1 = TA_ADXR(pTVar5->startIdx,pTVar5->endIdx,gBuffer[3].in,gBuffer[1].in,gBuffer[2].in,
                      pTVar5->optInTimePeriod,&outBegIdx,&outNbElement,gBuffer[3].in);
      break;
    default:
      TVar1 = TA_BAD_PARAM;
    }
    EVar2 = checkDataSame(gBuffer[1].in,history->low,history->nbBars);
    if (((EVar2 != TA_TEST_PASS) ||
        (EVar2 = checkDataSame(gBuffer[2].in,history->close,history->nbBars), EVar2 != TA_TEST_PASS)
        ) || (EVar2 = checkSameContent(gBuffer[0].out0,gBuffer[3].in), EVar2 != TA_TEST_PASS))
    goto LAB_001156ee;
    EVar2 = checkExpectedValue(gBuffer[3].in,TVar1,pTVar5->expectedRetCode,outBegIdx,
                               pTVar5->expectedBegIdx,outNbElement,pTVar5->expectedNbElement,
                               pTVar5->oneOfTheExpectedOutReal0,
                               pTVar5->oneOfTheExpectedOutRealIndex0);
    if (EVar2 != TA_TEST_PASS) goto LAB_001156f2;
    local_48 = history->high;
    pTStack_40 = history->low;
    local_38 = history->close;
    local_50 = pTVar5;
    if (pTVar5->doRangeTestFlag == 0) goto switchD_00115654_default;
    switch(pTVar5->id) {
    case TEST_STOCH:
      unstId = TA_FUNC_UNST_MINUS_DM;
      goto LAB_00115697;
    case TEST_STOCHF:
      unstId = TA_FUNC_UNST_MINUS_DI;
      break;
    case TEST_STOCHRSI:
      unstId = TA_FUNC_UNST_PLUS_DM;
LAB_00115697:
      integerTolerance = 0;
      goto LAB_001156c2;
    case TST_PLUS_DI:
      unstId = TA_FUNC_UNST_PLUS_DI;
      break;
    case TST_DX:
      unstId = TA_FUNC_UNST_DX;
      break;
    case TST_ADX:
    case TST_ADXR:
      unstId = TA_FUNC_UNST_ADX;
      break;
    default:
      goto switchD_00115654_default;
    }
    integerTolerance = 2;
LAB_001156c2:
    EVar2 = doRangeTest(rangeTestFunction,unstId,&local_50,1,integerTolerance);
    uVar4 = (ulong)EVar2;
    if (EVar2 != TA_TEST_PASS) {
LAB_00115729:
      printf("%s Failed Test #%d (Code=%d)\n",
             "/workspace/llm4binary/github/license_c_cmakelists/TA-Lib[P]ta-lib/src/tools/ta_regtest/ta_test_func/test_adx.c"
             ,uVar3 & 0xffffffff,uVar4);
      return (ErrorNumber)uVar4;
    }
switchD_00115654_default:
    uVar3 = uVar3 + 1;
    pTVar5 = pTVar5 + 1;
    if (uVar3 == 0x1e) {
      TA_SetUnstablePeriod(TA_FUNC_UNST_ALL,0);
      return TA_TEST_PASS;
    }
  } while( true );
}

Assistant:

ErrorNumber test_func_adx( TA_History *history )
{
   unsigned int i;
   ErrorNumber retValue;

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   for( i=0; i < NB_TEST; i++ )
   {
      if( (int)tableTest[i].expectedNbElement > (int)history->nbBars )
      {
         printf( "%s Failed Bad Parameter for Test #%d (%d,%d)\n", __FILE__,
                 i, tableTest[i].expectedNbElement, history->nbBars );
         return TA_TESTUTIL_TFRR_BAD_PARAM;
      }

      retValue = do_test( history, &tableTest[i] );
      if( retValue != 0 )
      {
         printf( "%s Failed Test #%d (Code=%d)\n", __FILE__,
                 i, retValue );
         return retValue;
      }
   }

   /* Re-initialize all the unstable period to zero. */
   TA_SetUnstablePeriod( TA_FUNC_UNST_ALL, 0 );

   /* All test succeed. */
   return TA_TEST_PASS;
}